

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCopyMultiPartFile.cpp
# Opt level: O1

bool anon_unknown.dwarf_f0d44::checkPixels<float>
               (Array2D<unsigned_int> *sampleCount,Array2D<float_*> *ph,int width,int height)

{
  float fVar1;
  ulong uVar2;
  ostream *poVar3;
  long *plVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  float fVar12;
  
  bVar11 = height < 1;
  if (0 < height) {
    uVar8 = 0;
    bVar11 = false;
    do {
      if (0 < width) {
        bVar9 = false;
        uVar5 = 0;
        do {
          uVar2 = (ulong)sampleCount->_data[sampleCount->_sizeY * uVar8 + uVar5];
          if (uVar2 != 0) {
            iVar6 = ((int)uVar8 * width + (int)uVar5) % 0x801;
            fVar12 = (float)iVar6;
            fVar1 = *ph->_data[ph->_sizeY * uVar8 + uVar5];
            if ((fVar1 != fVar12) || (NAN(fVar1) || NAN(fVar12))) {
              bVar10 = true;
              uVar7 = 0;
            }
            else {
              uVar7 = 0;
              do {
                if (uVar2 - 1 == uVar7) goto LAB_0014d461;
                fVar1 = ph->_data[ph->_sizeY * uVar8 + uVar5][uVar7 + 1];
                uVar7 = uVar7 + 1;
              } while ((fVar1 == fVar12) && (!NAN(fVar1) && !NAN(fVar12)));
              bVar10 = uVar7 < uVar2;
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"value at ",9);
            poVar3 = (ostream *)std::ostream::operator<<(&std::cout,(int)uVar5);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
            poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)uVar8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,", sample ",9);
            poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,": ",2);
            poVar3 = std::ostream::_M_insert<double>
                               ((double)ph->_data[ph->_sizeY * uVar8 + uVar5][uVar7]);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,", should be ",0xc);
            plVar4 = (long *)std::ostream::operator<<(poVar3,iVar6);
            std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
            std::ostream::put((char)plVar4);
            std::ostream::flush();
            std::ostream::flush();
            if (bVar10) {
              if (!bVar9) {
                return bVar11;
              }
              break;
            }
          }
LAB_0014d461:
          uVar2 = uVar5 + 1;
          bVar9 = (long)(width + -1) <= (long)uVar5;
          uVar5 = uVar2;
        } while (uVar2 != (uint)width);
      }
      bVar11 = height - 1 <= uVar8;
      uVar8 = uVar8 + 1;
    } while (uVar8 != (uint)height);
  }
  return bVar11;
}

Assistant:

bool
checkPixels (
    Array2D<unsigned int>& sampleCount, Array2D<T*>& ph, int width, int height)
{
    return checkPixels<T> (sampleCount, ph, 0, width - 1, 0, height - 1, width);
}